

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

void tty_cmd(void)

{
  if ((char)*(undefined2 *)DLTTYPortCmd < '\0') {
    switch((char)*(undefined2 *)DLTTYPortCmd) {
    case -0x80:
      tty_put();
      break;
    case -0x7f:
      tty_setparam();
      break;
    default:
      error("TTY: tty_cmd");
      break;
    case -0x7d:
      tty_open();
      break;
    case -0x7c:
      tty_close();
      break;
    case -0x7a:
      tty_breakon();
      break;
    case -0x79:
      tty_breakoff();
    }
    *(ushort *)DLTTYPortCmd = *(ushort *)DLTTYPortCmd & 0xff7f;
  }
  return;
}

Assistant:

void tty_cmd(void)
{
  if (DLTTYPortCmd->command >= PUT_CHAR) {
    if (DLTTYPortCmd->command == PUT_CHAR)
      tty_put();
    else if (DLTTYPortCmd->command == SET_PARAM)
      tty_setparam();
    else if (DLTTYPortCmd->command == TTY_ON)
      tty_open();
    else if (DLTTYPortCmd->command == TTY_OFF)
      tty_close();
    else if (DLTTYPortCmd->command == TTY_BREAK_ON)
      tty_breakon();
    else if (DLTTYPortCmd->command == TTY_BREAK_OFF)
      tty_breakoff();
    else
      error("TTY: tty_cmd");

    DLTTYPortCmd->command &= ~PUT_CHAR;
  }
}